

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_jsr(ExecutionEngine *this)

{
  Value operand;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  undefined4 local_40;
  Value returnAddr;
  int16_t branchOffset;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar1 = Frame::getCode(this_01,this_01->pc);
  returnAddr.data.longValue._7_1_ = puVar1[1];
  returnAddr.data.longValue._6_1_ = puVar1[2];
  operand.type = 8;
  operand.printType = local_40;
  operand.data.longValue._4_4_ = returnAddr.type;
  operand.data.intValue = this_01->pc + 3;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = (int)(short)returnAddr.data.longValue._6_2_ + this_01->pc;
  return;
}

Assistant:

void ExecutionEngine::i_jsr() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();
	
	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1];
	u1 byte2 = code[2];
	int16_t branchOffset = (byte1 << 8) | byte2;
	
	Value returnAddr;
	returnAddr.type = ValueType::RETURN_ADDR;
	returnAddr.data.returnAddress = topFrame->pc + 3; 
	topFrame->pushIntoOperandStack(returnAddr);
	
	topFrame->pc += branchOffset;
}